

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

int doMkdir(char *_dname,char *dname)

{
  DirHandle *h_00;
  int iVar1;
  PHYSFS_ErrorCode PVar2;
  char *pcVar3;
  bool local_6e;
  bool local_6d;
  undefined1 local_68 [4];
  int rc;
  PHYSFS_Stat statbuf;
  int exists;
  int retval;
  char *end;
  char *start;
  DirHandle *h;
  char *dname_local;
  char *_dname_local;
  
  h_00 = writeDir;
  statbuf.readonly = 0;
  statbuf.filetype = PHYSFS_FILETYPE_DIRECTORY;
  h = (DirHandle *)dname;
  dname_local = _dname;
  if (writeDir == (DirHandle *)0x0) {
    __assert_fail("h != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/icculus[P]physfs/src/physfs.c",
                  0x8b2,"int doMkdir(const char *, char *)");
  }
  iVar1 = sanitizePlatformIndependentPathWithRoot(writeDir,_dname,dname);
  if (iVar1 == 0) {
    _dname_local._4_4_ = 0;
  }
  else {
    iVar1 = verifyPath(h_00,(char **)&h,1);
    if (iVar1 == 0) {
      _dname_local._4_4_ = 0;
    }
    else {
      end = (char *)h;
      while( true ) {
        pcVar3 = strchr(end,0x2f);
        if (pcVar3 != (char *)0x0) {
          *pcVar3 = '\0';
        }
        if (statbuf.filetype != PHYSFS_FILETYPE_REGULAR) {
          iVar1 = (*h_00->funcs->stat)(h_00->opaque,(char *)h,(PHYSFS_Stat *)local_68);
          if ((iVar1 == 0) && (PVar2 = currentErrorCode(), PVar2 == PHYSFS_ERR_NOT_FOUND)) {
            statbuf.filetype = PHYSFS_FILETYPE_REGULAR;
          }
          local_6d = false;
          if (iVar1 != 0) {
            local_6e = (int)statbuf.accesstime == 1 || (int)statbuf.accesstime == 2;
            local_6d = local_6e;
          }
          statbuf.readonly = (int)local_6d;
        }
        if (statbuf.filetype == PHYSFS_FILETYPE_REGULAR) {
          statbuf.readonly = (*h_00->funcs->mkdir)(h_00->opaque,(char *)h);
        }
        if ((statbuf.readonly == 0) || (pcVar3 == (char *)0x0)) break;
        *pcVar3 = '/';
        end = pcVar3 + 1;
      }
      _dname_local._4_4_ = statbuf.readonly;
    }
  }
  return _dname_local._4_4_;
}

Assistant:

static int doMkdir(const char *_dname, char *dname)
{
    DirHandle *h = writeDir;
    char *start;
    char *end;
    int retval = 0;
    int exists = 1;  /* force existance check on first path element. */

    assert(h != NULL);

    BAIL_IF_ERRPASS(!sanitizePlatformIndependentPathWithRoot(h, _dname, dname), 0);
    BAIL_IF_ERRPASS(!verifyPath(h, &dname, 1), 0);

    start = dname;
    while (1)
    {
        end = strchr(start, '/');
        if (end != NULL)
            *end = '\0';

        /* only check for existance if all parent dirs existed, too... */
        if (exists)
        {
            PHYSFS_Stat statbuf;
            const int rc = h->funcs->stat(h->opaque, dname, &statbuf);
            if ((!rc) && (currentErrorCode() == PHYSFS_ERR_NOT_FOUND))
                exists = 0;
            /* verifyPath made sure that (dname) doesn't have symlinks if they aren't
               allowed, but it's possible the mounted writeDir itself has symlinks in it,
               (for example "/var" on iOS is a symlink, and the prefpath will be somewhere
               under that)...if we mounted that writeDir, we must allow those symlinks here
               unconditionally. */
            retval = ( (rc) && ((statbuf.filetype == PHYSFS_FILETYPE_DIRECTORY) || (statbuf.filetype == PHYSFS_FILETYPE_SYMLINK)) );
        } /* if */

        if (!exists)
            retval = h->funcs->mkdir(h->opaque, dname);

        if (!retval)
            break;

        if (end == NULL)
            break;

        *end = '/';
        start = end + 1;
    } /* while */

    return retval;
}